

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITTimePolymorphicInlineCacheInfo.cpp
# Opt level: O0

void JITTimePolymorphicInlineCacheInfo::InitializeEntryPointPolymorphicInlineCacheInfo
               (Recycler *recycler,EntryPointPolymorphicInlineCacheInfo *runtimeInfo,
               CodeGenWorkItemIDL *jitInfo)

{
  code *pcVar1;
  SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount> *this;
  EntryPointPolymorphicInlineCacheInfo *pEVar2;
  bool bVar3;
  uint uVar4;
  Recycler *pRVar5;
  FunctionBody *this_00;
  undefined4 *puVar6;
  SListNodeBase<Memory::Recycler> **ppSVar7;
  WriteBarrierPtr *this_01;
  PolymorphicInlineCacheInfo **ppPVar8;
  PolymorphicInlineCacheInfo *inlineeInfo;
  undefined1 auStack_e8 [4];
  uint i;
  Iterator iter;
  TrackAllocData local_c8;
  uint local_9c;
  PolymorphicInlineCacheInfoIDL *pPStack_98;
  uint inlineeCount;
  PolymorphicInlineCacheInfoIDL *inlineeInfoIDL;
  undefined8 local_88;
  TrackAllocData local_80;
  FunctionBody *local_58;
  PolymorphicInlineCacheInfoIDL *selfInfoIDL;
  SListCounted<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler> *inlineeList;
  PolymorphicInlineCacheInfo *selfInfo;
  CodeGenWorkItemIDL *jitInfo_local;
  EntryPointPolymorphicInlineCacheInfo *runtimeInfo_local;
  Recycler *recycler_local;
  SListNodeBase<Memory::Recycler> local_20;
  undefined1 *local_18;
  bool local_9;
  
  if (runtimeInfo != (EntryPointPolymorphicInlineCacheInfo *)0x0) {
    selfInfo = (PolymorphicInlineCacheInfo *)jitInfo;
    jitInfo_local = (CodeGenWorkItemIDL *)runtimeInfo;
    runtimeInfo_local = (EntryPointPolymorphicInlineCacheInfo *)recycler;
    inlineeList = (SListCounted<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler> *)
                  Js::EntryPointPolymorphicInlineCacheInfo::GetSelfInfo(runtimeInfo);
    selfInfoIDL = (PolymorphicInlineCacheInfoIDL *)
                  Js::EntryPointPolymorphicInlineCacheInfo::GetInlineeInfo
                            ((EntryPointPolymorphicInlineCacheInfo *)jitInfo_local);
    pEVar2 = runtimeInfo_local;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_80,(type_info *)&PolymorphicInlineCacheInfoIDL::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimePolymorphicInlineCacheInfo.cpp"
               ,0x1a);
    pRVar5 = Memory::Recycler::TrackAllocInfo((Recycler *)pEVar2,&local_80);
    inlineeInfoIDL = (PolymorphicInlineCacheInfoIDL *)Memory::Recycler::AllocZeroInlined;
    local_88 = 0;
    this_00 = (FunctionBody *)new<Memory::Recycler>(0x20,pRVar5,0x744a10);
    PolymorphicInlineCacheInfoIDL::PolymorphicInlineCacheInfoIDL
              ((PolymorphicInlineCacheInfoIDL *)this_00);
    pPStack_98 = (PolymorphicInlineCacheInfoIDL *)0x0;
    local_58 = this_00;
    InitializePolymorphicInlineCacheInfo
              ((Recycler *)runtimeInfo_local,(PolymorphicInlineCacheInfo *)inlineeList,
               (PolymorphicInlineCacheInfoIDL *)this_00);
    bVar3 = SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>::Empty
                      ((SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount> *)
                       selfInfoIDL);
    if (!bVar3) {
      local_9c = RealCount::Count((RealCount *)&selfInfoIDL->polymorphicCacheUtilizationArray);
      pEVar2 = runtimeInfo_local;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_c8,(type_info *)&PolymorphicInlineCacheInfoIDL::typeinfo,0,(ulong)local_9c,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimePolymorphicInlineCacheInfo.cpp"
                 ,0x22);
      pRVar5 = Memory::Recycler::TrackAllocInfo((Recycler *)pEVar2,&local_c8);
      iter.current = (NodeBase *)Memory::Recycler::Alloc;
      pPStack_98 = Memory::AllocateArray<Memory::Recycler,PolymorphicInlineCacheInfoIDL,false>
                             ((Memory *)pRVar5,(Recycler *)Memory::Recycler::Alloc,0,(ulong)local_9c
                             );
      SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>::Iterator::Iterator
                ((Iterator *)auStack_e8,
                 (SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount> *)
                 selfInfoIDL);
      inlineeInfo._4_4_ = 0;
      while( true ) {
        local_18 = auStack_e8;
        if (iter.list ==
            (SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        this = _auStack_e8;
        SListNodeBase<Memory::Recycler>::Next(&local_20);
        ppSVar7 = Memory::WriteBarrierPtr::operator_cast_to_SListNodeBase__
                            ((WriteBarrierPtr *)&local_20);
        bVar3 = SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>::IsHead
                          (this,*ppSVar7);
        if (bVar3) {
          iter.list = (SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount> *)
                      0x0;
        }
        else {
          SListNodeBase<Memory::Recycler>::Next((SListNodeBase<Memory::Recycler> *)&recycler_local);
          ppSVar7 = Memory::WriteBarrierPtr::operator_cast_to_SListNodeBase__
                              ((WriteBarrierPtr *)&recycler_local);
          iter.list = (SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount> *)
                      *ppSVar7;
        }
        local_9 = !bVar3;
        if (!local_9) break;
        this_01 = (WriteBarrierPtr *)
                  SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>::Iterator
                  ::Data((Iterator *)auStack_e8);
        ppPVar8 = Memory::WriteBarrierPtr::operator_cast_to_PolymorphicInlineCacheInfo__(this_01);
        InitializePolymorphicInlineCacheInfo
                  ((Recycler *)runtimeInfo_local,*ppPVar8,pPStack_98 + inlineeInfo._4_4_);
        inlineeInfo._4_4_ = inlineeInfo._4_4_ + 1;
      }
      if (inlineeInfo._4_4_ != local_9c) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimePolymorphicInlineCacheInfo.cpp"
                           ,0x2c,"(i == inlineeCount)","i == inlineeCount");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
    }
    uVar4 = RealCount::Count((RealCount *)&selfInfoIDL->polymorphicCacheUtilizationArray);
    *(uint *)&(selfInfo->polymorphicInlineCaches).field_0xc = uVar4;
    (selfInfo->functionBody).ptr = local_58;
    selfInfo[1].polymorphicInlineCaches.inlineCaches.ptr =
         (WriteBarrierPtr<Js::PolymorphicInlineCache> *)pPStack_98;
  }
  return;
}

Assistant:

void
JITTimePolymorphicInlineCacheInfo::InitializeEntryPointPolymorphicInlineCacheInfo(
    __in Recycler * recycler,
    __in Js::EntryPointPolymorphicInlineCacheInfo * runtimeInfo,
    __out CodeGenWorkItemIDL * jitInfo)
{
    if (runtimeInfo == nullptr)
    {
        return;
    }
    Js::PolymorphicInlineCacheInfo * selfInfo = runtimeInfo->GetSelfInfo();
    SListCounted<Js::PolymorphicInlineCacheInfo*, Recycler> * inlineeList = runtimeInfo->GetInlineeInfo();
    PolymorphicInlineCacheInfoIDL* selfInfoIDL = RecyclerNewStructZ(recycler, PolymorphicInlineCacheInfoIDL);
    PolymorphicInlineCacheInfoIDL* inlineeInfoIDL = nullptr;

    JITTimePolymorphicInlineCacheInfo::InitializePolymorphicInlineCacheInfo(recycler, selfInfo, selfInfoIDL);
    
    if (!inlineeList->Empty())
    {
        const uint inlineeCount = inlineeList->Count();
        inlineeInfoIDL = RecyclerNewArray(recycler, PolymorphicInlineCacheInfoIDL, inlineeCount);
        SListCounted<Js::PolymorphicInlineCacheInfo*, Recycler>::Iterator iter(inlineeList);
        uint i = 0;
        while (iter.Next())
        {
            Js::PolymorphicInlineCacheInfo * inlineeInfo = iter.Data();
            __analysis_assume(i < inlineeCount);
            JITTimePolymorphicInlineCacheInfo::InitializePolymorphicInlineCacheInfo(recycler, inlineeInfo, &inlineeInfoIDL[i]);
            ++i;
        }
        Assert(i == inlineeCount);
    }
    jitInfo->inlineeInfoCount = inlineeList->Count();
    jitInfo->selfInfo = selfInfoIDL;
    jitInfo->inlineeInfo = inlineeInfoIDL;
}